

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  fpclass_type fVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  int32_t iVar6;
  bool bVar7;
  int iVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  int32_t iVar14;
  undefined1 auVar15 [16];
  bool bVar16;
  int iVar17;
  double *pdVar18;
  ulong *puVar19;
  long lVar20;
  int *piVar21;
  undefined8 *puVar22;
  uint *puVar23;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  pointer pnVar25;
  cpp_dec_float<50U,_int,_void> *pcVar26;
  int32_t *piVar28;
  undefined8 uVar29;
  ZeroObjColSingletonPS *pZVar30;
  int32_t *piVar31;
  int *piVar32;
  cpp_dec_float<50U,_int,_void> *pcVar33;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar34;
  cpp_dec_float<50U,_int,_void> *pcVar35;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar36;
  VarStatus VVar37;
  int *piVar38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_18;
  cpp_dec_float<50U,_int,_void> local_6e8;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_6b0;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6a8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6a0;
  cpp_dec_float<50U,_int,_void> *local_698;
  undefined8 uStack_690;
  cpp_dec_float<50U,_int,_void> local_688;
  int local_64c;
  int *local_648;
  cpp_dec_float<50U,_int,_void> local_640;
  ZeroObjColSingletonPS *local_608;
  undefined8 uStack_600;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_5f0;
  int *local_5e8;
  undefined8 uStack_5e0;
  cpp_dec_float<50U,_int,_void> *local_5d0;
  cpp_dec_float<50U,_int,_void> local_5c8;
  cpp_dec_float<50U,_int,_void> local_588;
  cpp_dec_float<50U,_int,_void> local_548;
  cpp_dec_float<50U,_int,_void> local_508;
  cpp_dec_float<50U,_int,_void> local_4c8;
  cpp_dec_float<50U,_int,_void> local_488;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_450;
  cpp_dec_float<50U,_int,_void> local_448;
  cpp_dec_float<50U,_int,_void> local_408;
  uint local_3c8 [2];
  long lStack_3c0;
  uint local_3b8 [2];
  undefined8 uStack_3b0;
  uint local_3a8 [4];
  uint local_398 [2];
  uint auStack_390 [2];
  uint local_388 [2];
  undefined8 uStack_380;
  undefined8 local_378;
  uint local_368 [2];
  uint auStack_360 [2];
  uint local_358 [2];
  undefined8 uStack_350;
  uint local_348 [4];
  uint local_338 [2];
  uint auStack_330 [2];
  uint local_328 [2];
  undefined8 uStack_320;
  undefined8 local_318;
  uint local_308 [2];
  long lStack_300;
  uint local_2f8 [2];
  uint uStack_2f0;
  undefined3 uStack_2eb;
  uint local_2e8;
  undefined3 uStack_2e3;
  uint local_2d8 [2];
  uint auStack_2d0 [2];
  uint local_2c8 [2];
  uint uStack_2c0;
  undefined3 uStack_2bb;
  uint local_2b8;
  undefined3 uStack_2b3;
  uint local_2a8 [2];
  uint auStack_2a0 [2];
  uint local_298 [2];
  uint auStack_290 [2];
  uint local_288 [4];
  uint local_278 [2];
  uint auStack_270 [2];
  uint local_268 [2];
  uint auStack_260 [2];
  uint local_258 [4];
  uint local_248 [2];
  uint auStack_240 [2];
  uint local_238 [2];
  undefined8 uStack_230;
  undefined8 local_228;
  uint local_218 [2];
  uint auStack_210 [2];
  uint local_208 [2];
  undefined8 uStack_200;
  undefined8 local_1f8;
  uint local_1e8 [2];
  uint auStack_1e0 [2];
  uint local_1d8 [2];
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined1 local_1b8 [29];
  undefined3 uStack_19b;
  undefined1 auStack_198 [13];
  undefined8 local_188;
  cpp_dec_float<50U,_int,_void> local_180;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  undefined7 uVar27;
  
  pcVar26 = &local_6e8;
  pcVar35 = &local_6e8;
  iVar17 = this->m_j;
  iVar8 = this->m_old_j;
  if (iVar17 != iVar8) {
    pnVar25 = (x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar25[iVar8].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 8);
    uVar10 = *(undefined8 *)&pnVar25[iVar17].m_backend.data;
    uVar12 = *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 2);
    puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
    uVar13 = *(undefined8 *)(puVar23 + 2);
    puVar2 = pnVar25[iVar8].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar23;
    *(undefined8 *)(puVar2 + 2) = uVar13;
    *(undefined8 *)&pnVar25[iVar8].m_backend.data = uVar10;
    *(undefined8 *)(pnVar25[iVar8].m_backend.data._M_elems + 2) = uVar12;
    pnVar25[iVar8].m_backend.exp = pnVar25[iVar17].m_backend.exp;
    pnVar25[iVar8].m_backend.neg = pnVar25[iVar17].m_backend.neg;
    iVar14 = pnVar25[iVar17].m_backend.prec_elem;
    pnVar25[iVar8].m_backend.fpclass = pnVar25[iVar17].m_backend.fpclass;
    pnVar25[iVar8].m_backend.prec_elem = iVar14;
    iVar17 = this->m_j;
    pnVar25 = (r->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar8 = this->m_old_j;
    *(undefined8 *)(pnVar25[iVar8].m_backend.data._M_elems + 8) =
         *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 8);
    uVar10 = *(undefined8 *)&pnVar25[iVar17].m_backend.data;
    uVar12 = *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 2);
    puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
    uVar13 = *(undefined8 *)(puVar23 + 2);
    puVar2 = pnVar25[iVar8].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = *(undefined8 *)puVar23;
    *(undefined8 *)(puVar2 + 2) = uVar13;
    *(undefined8 *)&pnVar25[iVar8].m_backend.data = uVar10;
    *(undefined8 *)(pnVar25[iVar8].m_backend.data._M_elems + 2) = uVar12;
    pnVar25[iVar8].m_backend.exp = pnVar25[iVar17].m_backend.exp;
    pnVar25[iVar8].m_backend.neg = pnVar25[iVar17].m_backend.neg;
    iVar14 = pnVar25[iVar17].m_backend.prec_elem;
    pnVar25[iVar8].m_backend.fpclass = pnVar25[iVar17].m_backend.fpclass;
    pnVar25[iVar8].m_backend.prec_elem = iVar14;
    iVar17 = this->m_j;
    cStatus->data[this->m_old_j] = cStatus->data[iVar17];
  }
  local_6a0 = x;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[]((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_640,
               &(this->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,iVar17);
  iVar17 = this->m_i;
  pnVar25 = (s->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 8);
  local_1e8 = pnVar25[iVar17].m_backend.data._M_elems[0];
  auStack_1e0 = *(uint (*) [2])(pnVar25[iVar17].m_backend.data._M_elems + 2);
  puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
  local_1d8 = *(uint (*) [2])puVar23;
  uStack_1d0 = *(undefined8 *)(puVar23 + 2);
  iVar8 = pnVar25[iVar17].m_backend.exp;
  bVar7 = pnVar25[iVar17].m_backend.neg;
  uVar10._0_4_ = pnVar25[iVar17].m_backend.fpclass;
  uVar10._4_4_ = pnVar25[iVar17].m_backend.prec_elem;
  uStack_5e0 = 0;
  local_188._0_4_ = cpp_dec_float_finite;
  local_188._4_4_ = 10;
  local_1b8._16_13_ = SUB1613((undefined1  [16])0x0,0);
  uStack_19b = 0;
  auStack_198 = SUB1613((undefined1  [16])0x0,3);
  local_1b8._0_16_ = (undefined1  [16])0x0;
  local_608 = this;
  local_5f0 = s;
  local_5e8 = (int *)uVar10;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)local_1b8,1e-06);
  pZVar30 = local_608;
  local_6e8.data._M_elems._32_5_ = SUB85(local_1c8,0);
  local_6e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_1c8 >> 0x28);
  local_6e8.data._M_elems[4] = local_1d8[0];
  local_6e8.data._M_elems[5] = local_1d8[1];
  local_6e8.data._M_elems._24_5_ = SUB85(uStack_1d0,0);
  local_6e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_1d0 >> 0x28);
  local_6e8.data._M_elems[0] = local_1e8[0];
  local_6e8.data._M_elems[1] = local_1e8[1];
  uVar12 = local_6e8.data._M_elems._0_8_;
  local_6e8.data._M_elems[2] = auStack_1e0[0];
  local_6e8.data._M_elems[3] = auStack_1e0[1];
  local_6e8.neg = bVar7;
  if ((bVar7 == true) &&
     (local_6e8.data._M_elems[0] = local_1e8[0],
     local_6e8.data._M_elems[0] != 0 || (fpclass_type)local_5e8 != cpp_dec_float_finite)) {
    local_6e8.neg = false;
  }
  piVar32 = &local_608->m_i;
  local_6e8.exp = iVar8;
  local_6e8._48_8_ = uVar10;
  local_6e8.data._M_elems._0_8_ = uVar12;
  if ((((fpclass_type)local_5e8 == cpp_dec_float_NaN) ||
      ((fpclass_type)local_188 == cpp_dec_float_NaN)) ||
     (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_6e8,(cpp_dec_float<50U,_int,_void> *)local_1b8),
     pVVar36 = local_5f0, 0 < iVar17)) {
    pVVar36 = local_5f0;
    pcVar33 = &(local_5f0->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[*piVar32].m_backend;
    ::soplex::infinity::__tls_init();
    pdVar18 = (double *)__tls_get_addr(&PTR_003b4b70);
    local_6e8.fpclass = cpp_dec_float_finite;
    local_6e8.prec_elem = 10;
    local_6e8.data._M_elems[0] = 0;
    local_6e8.data._M_elems[1] = 0;
    local_6e8.data._M_elems[2] = 0;
    local_6e8.data._M_elems[3] = 0;
    local_6e8.data._M_elems[4] = 0;
    local_6e8.data._M_elems[5] = 0;
    local_6e8.data._M_elems._24_5_ = 0;
    local_6e8.data._M_elems[7]._1_3_ = 0;
    local_6e8.data._M_elems._32_5_ = 0;
    local_6e8.data._M_elems[9]._1_3_ = 0;
    local_6e8.exp = 0;
    local_6e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_6e8,*pdVar18);
    pZVar30 = local_608;
    if (((pcVar33->fpclass != cpp_dec_float_NaN) && (local_6e8.fpclass != cpp_dec_float_NaN)) &&
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (pcVar33,&local_6e8), pZVar30 = local_608, -1 < iVar17)) {
      puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_6e8.data._M_elems._0_8_ = local_6e8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_6e8,"Simplifier: infinite activities - aborting unsimplification",
                 "");
      *puVar22 = &PTR__SPxException_003adbd8;
      puVar22[1] = puVar22 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar22 + 1),local_6e8.data._M_elems._0_8_,
                 local_6e8.data._M_elems._0_8_ + local_6e8.data._M_elems._8_8_);
      __cxa_throw(puVar22,&SPxException::typeinfo,SPxException::~SPxException);
    }
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)
               ((local_5f0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *piVar32),0.0);
  }
  local_6e8.exp = (pZVar30->m_lhs).m_backend.exp;
  local_6e8.neg = (pZVar30->m_lhs).m_backend.neg;
  iVar17 = pZVar30->m_i;
  pnVar25 = (pVVar36->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_6e8.fpclass = (pZVar30->m_lhs).m_backend.fpclass;
  local_6e8.prec_elem = (pZVar30->m_lhs).m_backend.prec_elem;
  local_1f8 = *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 8);
  local_218 = pnVar25[iVar17].m_backend.data._M_elems[0];
  auStack_210 = *(uint (*) [2])(pnVar25[iVar17].m_backend.data._M_elems + 2);
  puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
  local_208 = *(uint (*) [2])puVar23;
  uStack_200 = *(undefined8 *)(puVar23 + 2);
  local_688.exp = pnVar25[iVar17].m_backend.exp;
  local_688.neg = pnVar25[iVar17].m_backend.neg;
  fVar3 = pnVar25[iVar17].m_backend.fpclass;
  iVar5 = pnVar25[iVar17].m_backend.prec_elem;
  uVar10 = *(undefined8 *)((pZVar30->m_lhs).m_backend.data._M_elems + 8);
  local_6e8.data._M_elems._32_5_ = SUB85(uVar10,0);
  local_6e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_6e8.data._M_elems._0_8_ = *(undefined8 *)(pZVar30->m_lhs).m_backend.data._M_elems;
  local_6e8.data._M_elems._8_8_ = *(undefined8 *)((pZVar30->m_lhs).m_backend.data._M_elems + 2);
  local_6e8.data._M_elems._16_8_ = *(undefined8 *)((pZVar30->m_lhs).m_backend.data._M_elems + 4);
  uVar10 = *(undefined8 *)((pZVar30->m_lhs).m_backend.data._M_elems + 6);
  local_6e8.data._M_elems._24_5_ = SUB85(uVar10,0);
  local_6e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  if ((local_6e8.neg == true) &&
     (local_6e8.data._M_elems[0] != 0 || local_6e8.fpclass != cpp_dec_float_finite)) {
    local_6e8.neg = false;
  }
  local_688.data._M_elems._32_5_ = SUB85(local_1f8,0);
  local_688.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_1f8 >> 0x28);
  local_688.data._M_elems[4] = local_208[0];
  local_688.data._M_elems[5] = local_208[1];
  local_688.data._M_elems._24_5_ = SUB85(uStack_200,0);
  local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_200 >> 0x28);
  local_688.data._M_elems[0] = local_218[0];
  local_688.data._M_elems[1] = local_218[1];
  uVar10 = local_688.data._M_elems._0_8_;
  local_688.data._M_elems[2] = auStack_210[0];
  local_688.data._M_elems[3] = auStack_210[1];
  local_688.fpclass = fVar3;
  local_688.prec_elem = iVar5;
  if ((local_688.neg != false) &&
     (local_688.data._M_elems[0] = local_218[0],
     fVar3 != cpp_dec_float_finite || local_688.data._M_elems[0] != 0)) {
    local_688.neg = (bool)(local_688.neg ^ 1);
  }
  piVar31 = &local_6e8.prec_elem;
  local_688.data._M_elems._0_8_ = uVar10;
  if ((local_6e8.fpclass == cpp_dec_float_NaN) || (fVar3 == cpp_dec_float_NaN)) {
LAB_0032a4a0:
    piVar28 = &local_688.prec_elem;
    local_4c8.data._M_elems[9]._1_3_ = local_688.data._M_elems[9]._1_3_;
    local_4c8.data._M_elems._32_5_ = local_688.data._M_elems._32_5_;
    local_4c8.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
    local_4c8.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
    local_4c8.data._M_elems[4] = local_688.data._M_elems[4];
    local_4c8.data._M_elems[5] = local_688.data._M_elems[5];
    local_4c8.data._M_elems[0] = local_688.data._M_elems[0];
    local_4c8.data._M_elems[1] = local_688.data._M_elems[1];
    local_4c8.data._M_elems[2] = local_688.data._M_elems[2];
    local_4c8.data._M_elems[3] = local_688.data._M_elems[3];
    local_4c8.exp = local_688.exp;
    local_4c8.neg = local_688.neg;
    local_4c8.fpclass = fVar3;
  }
  else {
    iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_6e8,&local_688);
    if (iVar17 < 1) {
      fVar3 = local_688.fpclass;
      goto LAB_0032a4a0;
    }
    local_4c8.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
    local_4c8.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
    local_4c8.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
    local_4c8.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
    local_4c8.data._M_elems[4] = local_6e8.data._M_elems[4];
    local_4c8.data._M_elems[5] = local_6e8.data._M_elems[5];
    local_4c8.data._M_elems[0] = local_6e8.data._M_elems[0];
    local_4c8.data._M_elems[1] = local_6e8.data._M_elems[1];
    local_4c8.data._M_elems[2] = local_6e8.data._M_elems[2];
    local_4c8.data._M_elems[3] = local_6e8.data._M_elems[3];
    local_4c8.exp = local_6e8.exp;
    local_4c8.neg = local_6e8.neg;
    local_4c8.fpclass = local_6e8.fpclass;
    piVar28 = piVar31;
  }
  local_4c8.prec_elem = *piVar28;
  local_6e8.exp = (local_608->m_rhs).m_backend.exp;
  local_6e8.neg = (local_608->m_rhs).m_backend.neg;
  iVar17 = local_608->m_i;
  pnVar25 = (pVVar36->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_6e8.fpclass = (local_608->m_rhs).m_backend.fpclass;
  local_6e8.prec_elem = (local_608->m_rhs).m_backend.prec_elem;
  local_228 = *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 8);
  local_248 = pnVar25[iVar17].m_backend.data._M_elems[0];
  auStack_240 = *(uint (*) [2])(pnVar25[iVar17].m_backend.data._M_elems + 2);
  puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
  local_238 = *(uint (*) [2])puVar23;
  uStack_230 = *(undefined8 *)(puVar23 + 2);
  local_688.neg = pnVar25[iVar17].m_backend.neg;
  fVar4 = pnVar25[iVar17].m_backend.fpclass;
  iVar6 = pnVar25[iVar17].m_backend.prec_elem;
  uVar10 = *(undefined8 *)((local_608->m_rhs).m_backend.data._M_elems + 8);
  local_6e8.data._M_elems._32_5_ = SUB85(uVar10,0);
  local_6e8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  local_6e8.data._M_elems._0_8_ = *(undefined8 *)(local_608->m_rhs).m_backend.data._M_elems;
  local_6e8.data._M_elems._8_8_ = *(undefined8 *)((local_608->m_rhs).m_backend.data._M_elems + 2);
  local_6e8.data._M_elems._16_8_ = *(undefined8 *)((local_608->m_rhs).m_backend.data._M_elems + 4);
  uVar10 = *(undefined8 *)((local_608->m_rhs).m_backend.data._M_elems + 6);
  local_6e8.data._M_elems._24_5_ = SUB85(uVar10,0);
  local_6e8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
  if ((local_6e8.neg == true) &&
     (local_6e8.data._M_elems[0] != 0 || local_6e8.fpclass != cpp_dec_float_finite)) {
    local_6e8.neg = false;
  }
  local_688.data._M_elems._32_5_ = SUB85(local_228,0);
  local_688.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_228 >> 0x28);
  local_688.data._M_elems[4] = local_238[0];
  local_688.data._M_elems[5] = local_238[1];
  local_688.data._M_elems._24_5_ = SUB85(uStack_230,0);
  local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_230 >> 0x28);
  local_688.data._M_elems[0] = local_248[0];
  local_688.data._M_elems[1] = local_248[1];
  uVar10 = local_688.data._M_elems._0_8_;
  local_688.data._M_elems[2] = auStack_240[0];
  local_688.data._M_elems[3] = auStack_240[1];
  local_688.exp = pnVar25[iVar17].m_backend.exp;
  local_688.fpclass = fVar4;
  local_688.prec_elem = iVar6;
  if ((local_688.neg != false) &&
     (local_688.data._M_elems[0] = local_248[0],
     fVar4 != cpp_dec_float_finite || local_688.data._M_elems[0] != 0)) {
    local_688.neg = (bool)(local_688.neg ^ 1);
  }
  local_688.data._M_elems._0_8_ = uVar10;
  if ((local_6e8.fpclass == cpp_dec_float_NaN) || (fVar4 == cpp_dec_float_NaN)) {
LAB_0032a66d:
    piVar31 = &local_688.prec_elem;
    local_508.data._M_elems[9]._1_3_ = local_688.data._M_elems[9]._1_3_;
    local_508.data._M_elems._32_5_ = local_688.data._M_elems._32_5_;
    local_508.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
    local_508.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
    local_508.data._M_elems[4] = local_688.data._M_elems[4];
    local_508.data._M_elems[5] = local_688.data._M_elems[5];
    local_508.data._M_elems[0] = local_688.data._M_elems[0];
    local_508.data._M_elems[1] = local_688.data._M_elems[1];
    local_508.data._M_elems[2] = local_688.data._M_elems[2];
    local_508.data._M_elems[3] = local_688.data._M_elems[3];
    local_508.exp = local_688.exp;
    local_508.neg = local_688.neg;
    local_508.fpclass = fVar4;
  }
  else {
    iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_6e8,&local_688);
    if (iVar17 < 1) {
      fVar4 = local_688.fpclass;
      goto LAB_0032a66d;
    }
    local_508.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
    local_508.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
    local_508.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
    local_508.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
    local_508.data._M_elems[4] = local_6e8.data._M_elems[4];
    local_508.data._M_elems[5] = local_6e8.data._M_elems[5];
    local_508.data._M_elems[0] = local_6e8.data._M_elems[0];
    local_508.data._M_elems[1] = local_6e8.data._M_elems[1];
    local_508.data._M_elems[2] = local_6e8.data._M_elems[2];
    local_508.data._M_elems[3] = local_6e8.data._M_elems[3];
    local_508.exp = local_6e8.exp;
    local_508.neg = local_6e8.neg;
    local_508.fpclass = local_6e8.fpclass;
  }
  local_508.prec_elem = *piVar31;
  if (local_4c8.fpclass != cpp_dec_float_NaN) {
    local_6e8.fpclass = cpp_dec_float_finite;
    local_6e8.prec_elem = 10;
    local_6e8.data._M_elems[0] = 0;
    local_6e8.data._M_elems[1] = 0;
    local_6e8.data._M_elems[2] = 0;
    local_6e8.data._M_elems[3] = 0;
    local_6e8.data._M_elems[4] = 0;
    local_6e8.data._M_elems[5] = 0;
    local_6e8.data._M_elems._24_5_ = 0;
    local_6e8.data._M_elems[7]._1_3_ = 0;
    local_6e8.data._M_elems._32_5_ = 0;
    local_6e8.data._M_elems[9]._1_3_ = 0;
    local_6e8.exp = 0;
    local_6e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_6e8,1.0);
    iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_4c8,&local_6e8);
    if (iVar17 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_4c8,1.0);
    }
  }
  pnVar24 = &local_608->m_lhs;
  local_698 = &(local_608->m_rhs).m_backend;
  local_6b0 = cStatus;
  local_6a8 = r;
  local_5e8 = piVar32;
  local_450 = y;
  if (local_508.fpclass != cpp_dec_float_NaN) {
    local_6e8.fpclass = cpp_dec_float_finite;
    local_6e8.prec_elem = 10;
    local_6e8.data._M_elems[0] = 0;
    local_6e8.data._M_elems[1] = 0;
    local_6e8.data._M_elems[2] = 0;
    local_6e8.data._M_elems[3] = 0;
    local_6e8.data._M_elems[4] = 0;
    local_6e8.data._M_elems[5] = 0;
    local_6e8.data._M_elems._24_5_ = 0;
    local_6e8.data._M_elems[7]._1_3_ = 0;
    local_6e8.data._M_elems._32_5_ = 0;
    local_6e8.data._M_elems[9]._1_3_ = 0;
    local_6e8.exp = 0;
    local_6e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_6e8,1.0);
    iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_508,&local_6e8);
    if (iVar17 < 0) {
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_508,1.0);
    }
  }
  local_6e8.fpclass = cpp_dec_float_finite;
  local_6e8.prec_elem = 10;
  local_6e8.data._M_elems._0_16_ = ZEXT816(0);
  local_6e8.data._M_elems[4] = 0;
  local_6e8.data._M_elems[5] = 0;
  local_6e8.data._M_elems._24_5_ = 0;
  local_6e8.data._M_elems[7]._1_3_ = 0;
  local_6e8.data._M_elems._32_5_ = 0;
  local_6e8.data._M_elems[9]._1_3_ = 0;
  local_6e8.exp = 0;
  local_6e8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_6e8,&pnVar24->m_backend,&local_4c8);
  pVVar36 = local_5f0;
  pZVar30 = local_608;
  local_688.fpclass = cpp_dec_float_finite;
  local_688.prec_elem = 10;
  local_688.data._M_elems._0_16_ = ZEXT816(0);
  local_688.data._M_elems[4] = 0;
  local_688.data._M_elems[5] = 0;
  local_688.data._M_elems._24_5_ = 0;
  local_688.data._M_elems[7]._1_3_ = 0;
  local_688.data._M_elems._32_5_ = 0;
  local_688.data._M_elems[9]._1_3_ = 0;
  local_688.exp = 0;
  local_688.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_688,
             &(local_5f0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_608->m_i].m_backend,&local_4c8);
  auVar15 = (undefined1  [16])local_6e8.data._M_elems._0_16_;
  local_488.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
  local_488.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
  local_488.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
  local_488.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
  local_488.data._M_elems[4] = local_6e8.data._M_elems[4];
  local_488.data._M_elems[5] = local_6e8.data._M_elems[5];
  local_488.data._M_elems[0] = local_6e8.data._M_elems[0];
  local_488.data._M_elems[1] = local_6e8.data._M_elems[1];
  local_488.data._M_elems[2] = local_6e8.data._M_elems[2];
  local_488.data._M_elems[3] = local_6e8.data._M_elems[3];
  local_488.exp = local_6e8.exp;
  local_488.neg = local_6e8.neg;
  local_488.fpclass = local_6e8.fpclass;
  local_488.prec_elem = local_6e8.prec_elem;
  local_6e8.data._M_elems._0_16_ = auVar15;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_488,&local_688);
  local_6e8.fpclass = cpp_dec_float_finite;
  local_6e8.prec_elem = 10;
  local_6e8.data._M_elems._0_16_ = ZEXT816(0);
  local_6e8.data._M_elems[4] = 0;
  local_6e8.data._M_elems[5] = 0;
  local_6e8.data._M_elems._24_5_ = 0;
  local_6e8.data._M_elems[7]._1_3_ = 0;
  local_6e8.data._M_elems._32_5_ = 0;
  local_6e8.data._M_elems[9]._1_3_ = 0;
  local_6e8.exp = 0;
  local_6e8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_6e8,local_698,&local_508);
  local_688.fpclass = cpp_dec_float_finite;
  local_688.prec_elem = 10;
  local_688.data._M_elems[0] = 0;
  local_688.data._M_elems[1] = 0;
  local_688.data._M_elems[2] = 0;
  local_688.data._M_elems[3] = 0;
  local_688.data._M_elems[4] = 0;
  local_688.data._M_elems[5] = 0;
  local_688.data._M_elems._24_5_ = 0;
  local_688.data._M_elems[7]._1_3_ = 0;
  local_688.data._M_elems._32_5_ = 0;
  local_688.data._M_elems[9]._1_3_ = 0;
  local_688.exp = 0;
  local_688.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_688,
             &(pVVar36->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[pZVar30->m_i].m_backend,&local_508);
  auVar15 = (undefined1  [16])local_6e8.data._M_elems._0_16_;
  local_548.data._M_elems[9]._1_3_ = local_6e8.data._M_elems[9]._1_3_;
  local_548.data._M_elems._32_5_ = local_6e8.data._M_elems._32_5_;
  local_548.data._M_elems[7]._1_3_ = local_6e8.data._M_elems[7]._1_3_;
  local_548.data._M_elems._24_5_ = local_6e8.data._M_elems._24_5_;
  local_548.data._M_elems[4] = local_6e8.data._M_elems[4];
  local_548.data._M_elems[5] = local_6e8.data._M_elems[5];
  local_548.data._M_elems[0] = local_6e8.data._M_elems[0];
  local_548.data._M_elems[1] = local_6e8.data._M_elems[1];
  local_548.data._M_elems[2] = local_6e8.data._M_elems[2];
  local_548.data._M_elems[3] = local_6e8.data._M_elems[3];
  local_548.exp = local_6e8.exp;
  local_548.neg = local_6e8.neg;
  local_548.fpclass = local_6e8.fpclass;
  local_548.prec_elem = local_6e8.prec_elem;
  local_6e8.data._M_elems._0_16_ = auVar15;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=(&local_548,&local_688);
  uVar12 = local_488._48_8_;
  bVar7 = local_488.neg;
  iVar17 = local_488.exp;
  local_278[0] = local_488.data._M_elems[0];
  local_278[1] = local_488.data._M_elems[1];
  auStack_270[0] = local_488.data._M_elems[2];
  auStack_270[1] = local_488.data._M_elems[3];
  local_268[0] = local_488.data._M_elems[4];
  local_268[1] = local_488.data._M_elems[5];
  auStack_260[0] = local_488.data._M_elems[6];
  auStack_260[1] = local_488.data._M_elems[7];
  local_258[0] = local_488.data._M_elems[8];
  local_258[1] = local_488.data._M_elems[9];
  local_698 = (cpp_dec_float<50U,_int,_void> *)local_488._48_8_;
  uStack_690 = 0;
  (*(pZVar30->super_PostStep)._vptr_PostStep[7])(&local_a0,pZVar30);
  uVar13 = local_488._48_8_;
  local_6e8.data._M_elems._32_5_ = SUB85(local_258._0_8_,0);
  local_6e8.data._M_elems[9]._1_3_ = SUB83(local_258._0_8_,5);
  local_6e8.data._M_elems[4] = local_268[0];
  local_6e8.data._M_elems[5] = local_268[1];
  local_6e8.data._M_elems._24_5_ = auStack_260._0_5_;
  local_6e8.data._M_elems[7]._1_3_ = auStack_260[1]._1_3_;
  local_6e8.data._M_elems[0] = local_278[0];
  local_6e8.data._M_elems[1] = local_278[1];
  uVar10 = local_6e8.data._M_elems._0_8_;
  local_6e8.data._M_elems[2] = auStack_270[0];
  local_6e8.data._M_elems[3] = auStack_270[1];
  local_6e8.exp = iVar17;
  local_6e8.neg = bVar7;
  local_488.fpclass = (fpclass_type)uVar12;
  local_488.prec_elem = SUB84(uVar12,4);
  local_6e8.fpclass = local_488.fpclass;
  local_6e8.prec_elem = local_488.prec_elem;
  if ((bVar7 == true) &&
     (local_6e8.data._M_elems[0] = local_278[0],
     local_6e8.data._M_elems[0] != 0 || (fpclass_type)local_698 != cpp_dec_float_finite)) {
    local_6e8.neg = false;
  }
  piVar32 = local_5e8;
  local_488._48_8_ = uVar13;
  local_6e8.data._M_elems._0_8_ = uVar10;
  if ((((fpclass_type)local_698 != cpp_dec_float_NaN) && (local_a0.fpclass != cpp_dec_float_NaN)) &&
     (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_6e8,&local_a0), piVar32 = local_5e8, iVar17 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_488,0.0);
  }
  uVar12 = local_548._48_8_;
  bVar7 = local_548.neg;
  iVar17 = local_548.exp;
  local_288[0] = local_548.data._M_elems[8];
  local_288[1] = local_548.data._M_elems[9];
  local_298[0] = local_548.data._M_elems[4];
  local_298[1] = local_548.data._M_elems[5];
  auStack_290[0] = local_548.data._M_elems[6];
  auStack_290[1] = local_548.data._M_elems[7];
  local_2a8[0] = local_548.data._M_elems[0];
  local_2a8[1] = local_548.data._M_elems[1];
  auStack_2a0[0] = local_548.data._M_elems[2];
  auStack_2a0[1] = local_548.data._M_elems[3];
  local_698 = (cpp_dec_float<50U,_int,_void> *)local_548._48_8_;
  uStack_690 = 0;
  (*(pZVar30->super_PostStep)._vptr_PostStep[7])(&local_d8);
  uVar13 = local_548._48_8_;
  local_6e8.data._M_elems._32_5_ = SUB85(local_288._0_8_,0);
  local_6e8.data._M_elems[9]._1_3_ = SUB83(local_288._0_8_,5);
  local_6e8.data._M_elems[4] = local_298[0];
  local_6e8.data._M_elems[5] = local_298[1];
  local_6e8.data._M_elems._24_5_ = auStack_290._0_5_;
  local_6e8.data._M_elems[7]._1_3_ = auStack_290[1]._1_3_;
  local_6e8.data._M_elems[0] = local_2a8[0];
  local_6e8.data._M_elems[1] = local_2a8[1];
  uVar10 = local_6e8.data._M_elems._0_8_;
  local_6e8.data._M_elems[2] = auStack_2a0[0];
  local_6e8.data._M_elems[3] = auStack_2a0[1];
  local_6e8.exp = iVar17;
  local_6e8.neg = bVar7;
  local_548.fpclass = (fpclass_type)uVar12;
  local_548.prec_elem = SUB84(uVar12,4);
  local_6e8.fpclass = local_548.fpclass;
  local_6e8.prec_elem = local_548.prec_elem;
  if ((bVar7 == true) &&
     (local_6e8.data._M_elems[0] = local_2a8[0],
     local_6e8.data._M_elems[0] != 0 || (fpclass_type)local_698 != cpp_dec_float_finite)) {
    local_6e8.neg = false;
  }
  local_548._48_8_ = uVar13;
  local_6e8.data._M_elems._0_8_ = uVar10;
  if ((((fpclass_type)local_698 != cpp_dec_float_NaN) && (local_d8.fpclass != cpp_dec_float_NaN)) &&
     (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_6e8,&local_d8), iVar17 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_548,0.0);
  }
  if (local_640.fpclass == cpp_dec_float_NaN) {
LAB_0032ab6d:
    pcVar26 = &local_688;
    local_688.data._M_elems._32_5_ = local_548.data._M_elems._32_5_;
    local_688.data._M_elems[9]._1_3_ = local_548.data._M_elems[9]._1_3_;
    local_688.data._M_elems[4] = local_548.data._M_elems[4];
    local_688.data._M_elems[5] = local_548.data._M_elems[5];
    local_688.data._M_elems._24_5_ = local_548.data._M_elems._24_5_;
    local_688.data._M_elems[7]._1_3_ = local_548.data._M_elems[7]._1_3_;
    local_688.data._M_elems[0] = local_548.data._M_elems[0];
    local_688.data._M_elems[1] = local_548.data._M_elems[1];
    local_688.data._M_elems[2] = local_548.data._M_elems[2];
    local_688.data._M_elems[3] = local_548.data._M_elems[3];
    local_688.exp = local_548.exp;
    local_688.neg = local_548.neg;
    local_688.fpclass = local_548.fpclass;
    local_688.prec_elem = local_548.prec_elem;
    pcVar33 = &local_508;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_6e8,0,(type *)0x0);
    iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_640,&local_6e8);
    if (iVar17 < 1) goto LAB_0032ab6d;
    local_6e8.data._M_elems._32_5_ = local_488.data._M_elems._32_5_;
    local_6e8.data._M_elems[9]._1_3_ = local_488.data._M_elems[9]._1_3_;
    local_6e8.data._M_elems[4] = local_488.data._M_elems[4];
    local_6e8.data._M_elems[5] = local_488.data._M_elems[5];
    local_6e8.data._M_elems._24_5_ = local_488.data._M_elems._24_5_;
    local_6e8.data._M_elems[7]._1_3_ = local_488.data._M_elems[7]._1_3_;
    local_6e8.data._M_elems[0] = local_488.data._M_elems[0];
    local_6e8.data._M_elems[1] = local_488.data._M_elems[1];
    local_6e8.data._M_elems[2] = local_488.data._M_elems[2];
    local_6e8.data._M_elems[3] = local_488.data._M_elems[3];
    local_6e8.exp = local_488.exp;
    local_6e8.neg = local_488.neg;
    local_6e8.fpclass = local_488.fpclass;
    local_6e8.prec_elem = local_488.prec_elem;
    pcVar33 = &local_4c8;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(pcVar26,pcVar33);
  local_588.fpclass = cpp_dec_float_finite;
  local_588.prec_elem = 10;
  local_588.data._M_elems[0] = 0;
  local_588.data._M_elems[1] = 0;
  local_588.data._M_elems[2] = 0;
  local_588.data._M_elems[3] = 0;
  local_588.data._M_elems[4] = 0;
  local_588.data._M_elems[5] = 0;
  local_588.data._M_elems._24_5_ = 0;
  local_588.data._M_elems[7]._1_3_ = 0;
  local_588.data._M_elems._32_5_ = 0;
  local_588.data._M_elems[9]._1_3_ = 0;
  local_588.exp = 0;
  local_588.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_588,pcVar26,&local_640);
  if (local_640.fpclass == cpp_dec_float_NaN) {
LAB_0032ac83:
    pcVar35 = &local_688;
    local_688.data._M_elems._32_5_ = local_488.data._M_elems._32_5_;
    local_688.data._M_elems[9]._1_3_ = local_488.data._M_elems[9]._1_3_;
    local_688.data._M_elems[4] = local_488.data._M_elems[4];
    local_688.data._M_elems[5] = local_488.data._M_elems[5];
    local_688.data._M_elems._24_5_ = local_488.data._M_elems._24_5_;
    local_688.data._M_elems[7]._1_3_ = local_488.data._M_elems[7]._1_3_;
    local_688.data._M_elems[0] = local_488.data._M_elems[0];
    local_688.data._M_elems[1] = local_488.data._M_elems[1];
    local_688.data._M_elems[2] = local_488.data._M_elems[2];
    local_688.data._M_elems[3] = local_488.data._M_elems[3];
    local_688.exp = local_488.exp;
    local_688.neg = local_488.neg;
    local_688.fpclass = local_488.fpclass;
    local_688.prec_elem = local_488.prec_elem;
    pcVar26 = &local_4c8;
  }
  else {
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_6e8,0,(type *)0x0);
    iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_640,&local_6e8);
    if (iVar17 < 1) goto LAB_0032ac83;
    local_6e8.data._M_elems._32_5_ = local_548.data._M_elems._32_5_;
    local_6e8.data._M_elems[9]._1_3_ = local_548.data._M_elems[9]._1_3_;
    local_6e8.data._M_elems[4] = local_548.data._M_elems[4];
    local_6e8.data._M_elems[5] = local_548.data._M_elems[5];
    local_6e8.data._M_elems._24_5_ = local_548.data._M_elems._24_5_;
    local_6e8.data._M_elems[7]._1_3_ = local_548.data._M_elems[7]._1_3_;
    local_6e8.data._M_elems[0] = local_548.data._M_elems[0];
    local_6e8.data._M_elems[1] = local_548.data._M_elems[1];
    local_6e8.data._M_elems[2] = local_548.data._M_elems[2];
    local_6e8.data._M_elems[3] = local_548.data._M_elems[3];
    local_6e8.exp = local_548.exp;
    local_6e8.neg = local_548.neg;
    local_6e8.fpclass = local_548.fpclass;
    local_6e8.prec_elem = local_548.prec_elem;
    pcVar26 = &local_508;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(pcVar35,pcVar26);
  local_5c8.fpclass = cpp_dec_float_finite;
  local_5c8.prec_elem = 10;
  local_5c8.data._M_elems[0] = 0;
  local_5c8.data._M_elems[1] = 0;
  local_5c8.data._M_elems[2] = 0;
  local_5c8.data._M_elems[3] = 0;
  local_5c8.data._M_elems[4] = 0;
  local_5c8.data._M_elems[5] = 0;
  local_5c8.data._M_elems._24_5_ = 0;
  local_5c8.data._M_elems[7]._1_3_ = 0;
  local_5c8.data._M_elems._32_5_ = 0;
  local_5c8.data._M_elems[9]._1_3_ = 0;
  local_5c8.exp = 0;
  local_5c8.neg = false;
  boost::multiprecision::default_ops::
  eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_5c8,pcVar35,&local_640);
  uVar12 = local_588._48_8_;
  bVar7 = local_588.neg;
  iVar17 = local_588.exp;
  _uStack_2c0 = local_588.data._M_elems._24_5_;
  uStack_2bb = local_588.data._M_elems[7]._1_3_;
  local_2d8[0] = local_588.data._M_elems[0];
  local_2d8[1] = local_588.data._M_elems[1];
  auStack_2d0[0] = local_588.data._M_elems[2];
  auStack_2d0[1] = local_588.data._M_elems[3];
  local_2c8[0] = local_588.data._M_elems[4];
  local_2c8[1] = local_588.data._M_elems[5];
  _local_2b8 = local_588.data._M_elems._32_5_;
  uStack_2b3 = local_588.data._M_elems[9]._1_3_;
  local_698 = (cpp_dec_float<50U,_int,_void> *)local_588._48_8_;
  uStack_690 = 0;
  (*(pZVar30->super_PostStep)._vptr_PostStep[6])(&local_110,pZVar30);
  uVar13 = local_588._48_8_;
  local_6e8.data._M_elems._32_5_ = _local_2b8;
  local_6e8.data._M_elems[9]._1_3_ = uStack_2b3;
  local_6e8.data._M_elems[4] = local_2c8[0];
  local_6e8.data._M_elems[5] = local_2c8[1];
  local_6e8.data._M_elems._24_5_ = _uStack_2c0;
  local_6e8.data._M_elems[7]._1_3_ = uStack_2bb;
  local_6e8.data._M_elems[0] = local_2d8[0];
  local_6e8.data._M_elems[1] = local_2d8[1];
  uVar10 = local_6e8.data._M_elems._0_8_;
  local_6e8.data._M_elems[2] = auStack_2d0[0];
  local_6e8.data._M_elems[3] = auStack_2d0[1];
  local_6e8.exp = iVar17;
  local_6e8.neg = bVar7;
  local_588.fpclass = (fpclass_type)uVar12;
  local_588.prec_elem = SUB84(uVar12,4);
  local_6e8.fpclass = local_588.fpclass;
  local_6e8.prec_elem = local_588.prec_elem;
  if ((bVar7 == true) &&
     (local_6e8.data._M_elems[0] = local_2d8[0],
     local_6e8.data._M_elems[0] != 0 || (fpclass_type)local_698 != cpp_dec_float_finite)) {
    local_6e8.neg = false;
  }
  local_588._48_8_ = uVar13;
  local_6e8.data._M_elems._0_8_ = uVar10;
  if ((((fpclass_type)local_698 != cpp_dec_float_NaN) && (local_110.fpclass != cpp_dec_float_NaN))
     && (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_6e8,&local_110), iVar17 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_588,0.0);
  }
  uVar12 = local_5c8._48_8_;
  bVar7 = local_5c8.neg;
  iVar17 = local_5c8.exp;
  _local_2e8 = local_5c8.data._M_elems._32_5_;
  uStack_2e3 = local_5c8.data._M_elems[9]._1_3_;
  _uStack_2f0 = local_5c8.data._M_elems._24_5_;
  uStack_2eb = local_5c8.data._M_elems[7]._1_3_;
  local_2f8[0] = local_5c8.data._M_elems[4];
  local_2f8[1] = local_5c8.data._M_elems[5];
  local_308[0] = local_5c8.data._M_elems[0];
  local_308[1] = local_5c8.data._M_elems[1];
  lStack_300._0_4_ = local_5c8.data._M_elems[2];
  lStack_300._4_4_ = local_5c8.data._M_elems[3];
  local_698 = (cpp_dec_float<50U,_int,_void> *)local_5c8._48_8_;
  uStack_690 = 0;
  (*(pZVar30->super_PostStep)._vptr_PostStep[6])(&local_148);
  uVar13 = local_5c8._48_8_;
  local_6e8.data._M_elems._32_5_ = _local_2e8;
  local_6e8.data._M_elems[9]._1_3_ = uStack_2e3;
  local_6e8.data._M_elems[4] = local_2f8[0];
  local_6e8.data._M_elems[5] = local_2f8[1];
  local_6e8.data._M_elems._24_5_ = _uStack_2f0;
  local_6e8.data._M_elems[7]._1_3_ = uStack_2eb;
  local_6e8.data._M_elems[0] = local_308[0];
  local_6e8.data._M_elems[1] = local_308[1];
  uVar10 = local_6e8.data._M_elems._0_8_;
  local_6e8.data._M_elems[2] = (undefined4)lStack_300;
  local_6e8.data._M_elems[3] = lStack_300._4_4_;
  local_6e8.exp = iVar17;
  local_6e8.neg = bVar7;
  local_5c8.fpclass = (fpclass_type)uVar12;
  local_5c8.prec_elem = SUB84(uVar12,4);
  local_6e8.fpclass = local_5c8.fpclass;
  local_6e8.prec_elem = local_5c8.prec_elem;
  if ((bVar7 == true) &&
     (local_6e8.data._M_elems[0] = local_308[0],
     local_6e8.data._M_elems[0] != 0 || (fpclass_type)local_698 != cpp_dec_float_finite)) {
    local_6e8.neg = false;
  }
  local_5c8._48_8_ = uVar13;
  local_6e8.data._M_elems._0_8_ = uVar10;
  if ((((fpclass_type)local_698 != cpp_dec_float_NaN) && (local_148.fpclass != cpp_dec_float_NaN))
     && (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&local_6e8,&local_148), iVar17 < 1)) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_5c8,0.0);
  }
  uVar10 = local_588._48_8_;
  if (BASIC < rStatus->data[*piVar32]) {
switchD_0032af29_caseD_3:
    puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_6e8.data._M_elems._0_8_ = local_6e8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6e8,"XMAISM04 This should never happen.","");
    *puVar22 = &PTR__SPxException_003adbd8;
    puVar22[1] = puVar22 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar22 + 1),local_6e8.data._M_elems._0_8_,
               local_6e8.data._M_elems._0_8_ + local_6e8.data._M_elems._8_8_);
    *puVar22 = &PTR__SPxException_003ae9a0;
    __cxa_throw(puVar22,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  piVar21 = &pZVar30->m_j;
  puVar23 = &switchD_0032af29::switchdataD_00357278;
  piVar38 = piVar21;
  switch(rStatus->data[*piVar32]) {
  case ON_UPPER:
    ::soplex::infinity::__tls_init();
    puVar19 = (ulong *)__tls_get_addr(&PTR_003b4b70);
    local_698 = (cpp_dec_float<50U,_int,_void> *)*puVar19;
    uStack_690 = 0;
    local_6e8.fpclass = cpp_dec_float_finite;
    local_6e8.prec_elem = 10;
    local_6e8.data._M_elems[0] = 0;
    local_6e8.data._M_elems[1] = 0;
    local_6e8.data._M_elems[2] = 0;
    local_6e8.data._M_elems[3] = 0;
    local_6e8.data._M_elems[4] = 0;
    local_6e8.data._M_elems[5] = 0;
    local_6e8.data._M_elems._24_5_ = 0;
    local_6e8.data._M_elems[7]._1_3_ = 0;
    local_6e8.data._M_elems._32_5_ = 0;
    local_6e8.data._M_elems[9]._1_3_ = 0;
    local_6e8.exp = 0;
    local_6e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_6e8,-(double)local_698);
    if ((((pZVar30->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        (local_6e8.fpclass != cpp_dec_float_NaN)) &&
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&(pZVar30->m_lower).m_backend,&local_6e8), iVar17 < 1)) {
      ::soplex::infinity::__tls_init();
      local_688.fpclass = cpp_dec_float_finite;
      local_688.prec_elem = 10;
      local_688.data._M_elems[0] = 0;
      local_688.data._M_elems[1] = 0;
      local_688.data._M_elems[2] = 0;
      local_688.data._M_elems[3] = 0;
      local_688.data._M_elems[4] = 0;
      local_688.data._M_elems[5] = 0;
      local_688.data._M_elems._24_5_ = 0;
      local_688.data._M_elems[7]._1_3_ = 0;
      local_688.data._M_elems._32_5_ = 0;
      local_688.data._M_elems[9]._1_3_ = 0;
      local_688.exp = 0;
      local_688.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_688,(double)local_698);
      if ((((pZVar30->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_688.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&(pZVar30->m_upper).m_backend,&local_688), -1 < iVar17)) {
LAB_0032bfb8:
        pVVar34 = local_6a0;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((local_6a0->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *piVar21),0.0);
        pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_6b0->data;
        VVar37 = ZERO;
        pVVar36 = local_6a8;
        goto LAB_0032bc19;
      }
    }
    if ((((pZVar30->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
        ((pZVar30->m_upper).m_backend.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&(pZVar30->m_lower).m_backend,&(pZVar30->m_upper).m_backend),
       iVar17 != 0)) {
      if (local_640.fpclass == cpp_dec_float_NaN) goto LAB_0032b046;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&local_6e8,0,(type *)0x0);
      iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_640,&local_6e8);
      if (iVar17 < 1) {
        if (local_640.fpclass == cpp_dec_float_NaN) {
LAB_0032b046:
          puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
          local_6e8.data._M_elems._0_8_ = local_6e8.data._M_elems + 4;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_6e8,"XMAISM02 This should never happen.","");
          *puVar22 = &PTR__SPxException_003adbd8;
          puVar22[1] = puVar22 + 3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)(puVar22 + 1),local_6e8.data._M_elems._0_8_,
                     local_6e8.data._M_elems._0_8_ + local_6e8.data._M_elems._8_8_);
          *puVar22 = &PTR__SPxException_003ae9a0;
          __cxa_throw(puVar22,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_6e8,0,(type *)0x0);
        iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_640,&local_6e8);
        if (-1 < iVar17) goto LAB_0032b046;
        goto LAB_0032b5cf;
      }
LAB_0032bb94:
      iVar17 = pZVar30->m_j;
      pnVar25 = (local_6a0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 8) =
           *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 8);
      uVar10 = *(undefined8 *)(pZVar30->m_lower).m_backend.data._M_elems;
      uVar12 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 2);
      uVar13 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 6);
      puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar23 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 4);
      *(undefined8 *)(puVar23 + 2) = uVar13;
      *(undefined8 *)&pnVar25[iVar17].m_backend.data = uVar10;
      *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 2) = uVar12;
      pnVar25[iVar17].m_backend.exp = (pZVar30->m_lower).m_backend.exp;
      pnVar25[iVar17].m_backend.neg = (pZVar30->m_lower).m_backend.neg;
      iVar14 = (pZVar30->m_lower).m_backend.prec_elem;
      pnVar25[iVar17].m_backend.fpclass = (pZVar30->m_lower).m_backend.fpclass;
      pnVar25[iVar17].m_backend.prec_elem = iVar14;
      VVar37 = ON_LOWER;
LAB_0032bbf3:
      pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_6b0->data;
      piVar32 = local_5e8;
      pVVar34 = local_6a0;
      pVVar36 = local_6a8;
      goto LAB_0032bc19;
    }
LAB_0032bae0:
    lVar20 = (long)pZVar30->m_j;
    pnVar25 = (local_6a0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)(pnVar25[lVar20].m_backend.data._M_elems + 8) =
         *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 8);
    uVar10 = *(undefined8 *)(pZVar30->m_lower).m_backend.data._M_elems;
    uVar12 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 2);
    uVar13 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 6);
    puVar23 = pnVar25[lVar20].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar23 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 4);
    *(undefined8 *)(puVar23 + 2) = uVar13;
    *(undefined8 *)&pnVar25[lVar20].m_backend.data = uVar10;
    *(undefined8 *)(pnVar25[lVar20].m_backend.data._M_elems + 2) = uVar12;
    pnVar25[lVar20].m_backend.exp = (pZVar30->m_lower).m_backend.exp;
    pnVar25[lVar20].m_backend.neg = (pZVar30->m_lower).m_backend.neg;
    uVar29._0_4_ = (pZVar30->m_lower).m_backend.fpclass;
    uVar29._4_4_ = (pZVar30->m_lower).m_backend.prec_elem;
    break;
  case ON_LOWER:
    ::soplex::infinity::__tls_init();
    puVar19 = (ulong *)__tls_get_addr(&PTR_003b4b70);
    local_698 = (cpp_dec_float<50U,_int,_void> *)*puVar19;
    uStack_690 = 0;
    local_6e8.fpclass = cpp_dec_float_finite;
    local_6e8.prec_elem = 10;
    local_6e8.data._M_elems[0] = 0;
    local_6e8.data._M_elems[1] = 0;
    local_6e8.data._M_elems[2] = 0;
    local_6e8.data._M_elems[3] = 0;
    local_6e8.data._M_elems[4] = 0;
    local_6e8.data._M_elems[5] = 0;
    local_6e8.data._M_elems._24_5_ = 0;
    local_6e8.data._M_elems[7]._1_3_ = 0;
    local_6e8.data._M_elems._32_5_ = 0;
    local_6e8.data._M_elems[9]._1_3_ = 0;
    local_6e8.exp = 0;
    local_6e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_6e8,-(double)local_698);
    if ((((pZVar30->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
        (local_6e8.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&(pZVar30->m_lower).m_backend,&local_6e8), 0 < iVar17)) {
LAB_0032b568:
      if ((((pZVar30->m_lower).m_backend.fpclass == cpp_dec_float_NaN) ||
          ((pZVar30->m_upper).m_backend.fpclass == cpp_dec_float_NaN)) ||
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&(pZVar30->m_lower).m_backend,&(pZVar30->m_upper).m_backend),
         iVar17 != 0)) {
        if (local_640.fpclass == cpp_dec_float_NaN) goto LAB_0032c143;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_6e8,0,(type *)0x0);
        iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_640,&local_6e8);
        if (iVar17 < 1) {
          if (local_640.fpclass == cpp_dec_float_NaN) {
LAB_0032c143:
            puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_6e8.data._M_elems._0_8_ = local_6e8.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_6e8,"XMAISM01 This should never happen.","");
            *puVar22 = &PTR__SPxException_003adbd8;
            puVar22[1] = puVar22 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar22 + 1),local_6e8.data._M_elems._0_8_,
                       local_6e8.data._M_elems._0_8_ + local_6e8.data._M_elems._8_8_);
            *puVar22 = &PTR__SPxException_003ae9a0;
            __cxa_throw(puVar22,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&local_6e8,0,(type *)0x0);
          iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_640,&local_6e8);
          if (-1 < iVar17) goto LAB_0032c143;
          goto LAB_0032bb94;
        }
LAB_0032b5cf:
        VVar37 = ON_UPPER;
        iVar17 = pZVar30->m_j;
        pnVar25 = (local_6a0->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 8) =
             *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 8);
        uVar10 = *(undefined8 *)(pZVar30->m_upper).m_backend.data._M_elems;
        uVar12 = *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 2);
        uVar13 = *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 6);
        puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar23 = *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 4);
        *(undefined8 *)(puVar23 + 2) = uVar13;
        *(undefined8 *)&pnVar25[iVar17].m_backend.data = uVar10;
        *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 2) = uVar12;
        pnVar25[iVar17].m_backend.exp = (pZVar30->m_upper).m_backend.exp;
        pnVar25[iVar17].m_backend.neg = (pZVar30->m_upper).m_backend.neg;
        iVar14 = (pZVar30->m_upper).m_backend.prec_elem;
        pnVar25[iVar17].m_backend.fpclass = (pZVar30->m_upper).m_backend.fpclass;
        pnVar25[iVar17].m_backend.prec_elem = iVar14;
        goto LAB_0032bbf3;
      }
      goto LAB_0032bae0;
    }
    ::soplex::infinity::__tls_init();
    local_688.fpclass = cpp_dec_float_finite;
    local_688.prec_elem = 10;
    local_688.data._M_elems[0] = 0;
    local_688.data._M_elems[1] = 0;
    local_688.data._M_elems[2] = 0;
    local_688.data._M_elems[3] = 0;
    local_688.data._M_elems[4] = 0;
    local_688.data._M_elems[5] = 0;
    local_688.data._M_elems._24_5_ = 0;
    local_688.data._M_elems[7]._1_3_ = 0;
    local_688.data._M_elems._32_5_ = 0;
    local_688.data._M_elems[9]._1_3_ = 0;
    local_688.exp = 0;
    local_688.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_688,(double)local_698);
    if ((((pZVar30->m_upper).m_backend.fpclass == cpp_dec_float_NaN) ||
        (local_688.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&(pZVar30->m_upper).m_backend,&local_688), pVVar34 = local_6a0,
       iVar17 < 0)) goto LAB_0032b568;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)
               ((local_6a0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start + *piVar21),0.0);
    VVar37 = ZERO;
    pVVar36 = local_6a8;
    goto LAB_0032bb4a;
  case FIXED:
    ::soplex::infinity::__tls_init();
    pnVar24 = &pZVar30->m_lower;
    puVar19 = (ulong *)__tls_get_addr(&PTR_003b4b70);
    local_698 = (cpp_dec_float<50U,_int,_void> *)*puVar19;
    uStack_690 = 0;
    local_6e8.fpclass = cpp_dec_float_finite;
    local_6e8.prec_elem = 10;
    local_6e8.data._M_elems[0] = 0;
    local_6e8.data._M_elems[1] = 0;
    local_6e8.data._M_elems[2] = 0;
    local_6e8.data._M_elems[3] = 0;
    local_6e8.data._M_elems[4] = 0;
    local_6e8.data._M_elems[5] = 0;
    local_6e8.data._M_elems._24_5_ = 0;
    local_6e8.data._M_elems[7]._1_3_ = 0;
    local_6e8.data._M_elems._32_5_ = 0;
    local_6e8.data._M_elems[9]._1_3_ = 0;
    local_6e8.exp = 0;
    local_6e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_6e8,-(double)local_698);
    if ((((pZVar30->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
        (local_6e8.fpclass != cpp_dec_float_NaN)) &&
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar24->m_backend,&local_6e8), iVar17 < 1)) {
      ::soplex::infinity::__tls_init();
      local_688.fpclass = cpp_dec_float_finite;
      local_688.prec_elem = 10;
      local_688.data._M_elems[0] = 0;
      local_688.data._M_elems[1] = 0;
      local_688.data._M_elems[2] = 0;
      local_688.data._M_elems[3] = 0;
      local_688.data._M_elems[4] = 0;
      local_688.data._M_elems[5] = 0;
      local_688.data._M_elems._24_5_ = 0;
      local_688.data._M_elems[7]._1_3_ = 0;
      local_688.data._M_elems._32_5_ = 0;
      local_688.data._M_elems[9]._1_3_ = 0;
      local_688.exp = 0;
      local_688.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_688,(double)local_698);
      if ((((pZVar30->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_688.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&(pZVar30->m_upper).m_backend,&local_688), -1 < iVar17))
      goto LAB_0032bfb8;
    }
    pnVar1 = &pZVar30->m_upper;
    local_448.fpclass = cpp_dec_float_finite;
    local_448.prec_elem = 10;
    local_448.data._M_elems[0] = 0;
    local_448.data._M_elems[1] = 0;
    local_448.data._M_elems[2] = 0;
    local_448.data._M_elems[3] = 0;
    local_448.data._M_elems[4] = 0;
    local_448.data._M_elems[5] = 0;
    local_448.data._M_elems._24_5_ = 0;
    local_448.data._M_elems[7]._1_3_ = 0;
    local_448.data._M_elems[8] = 0;
    local_448.data._M_elems[9] = 0;
    local_448.exp = 0;
    local_448.neg = false;
    pcVar26 = &pnVar24->m_backend;
    if ((&local_448 != &pnVar1->m_backend) &&
       (pcVar26 = &pnVar1->m_backend, &local_448 != &pnVar24->m_backend)) {
      local_448.data._M_elems._32_8_ =
           *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 8);
      local_448.data._M_elems._0_16_ = *(undefined1 (*) [16])(pnVar24->m_backend).data._M_elems;
      local_448.data._M_elems._16_8_ =
           *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 4);
      uVar10 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 6);
      local_448.data._M_elems._24_5_ = SUB85(uVar10,0);
      local_448.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar10 >> 0x28);
      local_448.exp = (pZVar30->m_lower).m_backend.exp;
      local_448.neg = (pZVar30->m_lower).m_backend.neg;
      local_448.fpclass = (pZVar30->m_lower).m_backend.fpclass;
      local_448.prec_elem = (pZVar30->m_lower).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_448,pcVar26);
    local_688.fpclass = cpp_dec_float_finite;
    local_688.prec_elem = 10;
    local_688.data._M_elems[0] = 0;
    local_688.data._M_elems[1] = 0;
    local_688.data._M_elems[2] = 0;
    local_688.data._M_elems[3] = 0;
    local_688.data._M_elems[4] = 0;
    local_688.data._M_elems[5] = 0;
    local_688.data._M_elems._24_5_ = 0;
    local_688.data._M_elems[7]._1_3_ = 0;
    local_688.data._M_elems._32_5_ = 0;
    local_688.data._M_elems[9]._1_3_ = 0;
    local_688.exp = 0;
    local_688.neg = false;
    local_6e8.fpclass = cpp_dec_float_finite;
    local_6e8.prec_elem = 10;
    local_6e8.data._M_elems[0] = 0;
    local_6e8.data._M_elems[1] = 0;
    local_6e8.data._M_elems[2] = 0;
    local_6e8.data._M_elems[3] = 0;
    local_6e8.data._M_elems[4] = 0;
    local_6e8.data._M_elems[5] = 0;
    local_6e8.data._M_elems._24_5_ = 0;
    local_6e8.data._M_elems[7]._1_3_ = 0;
    local_6e8.data._M_elems._32_5_ = 0;
    local_6e8.data._M_elems[9]._1_3_ = 0;
    local_6e8.exp = 0;
    local_6e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_6e8,2.0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_688,&local_448,&local_6e8);
    lVar20 = (long)*piVar21;
    pnVar25 = (local_6a0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)(pnVar25[lVar20].m_backend.data._M_elems + 8) =
         CONCAT35(local_688.data._M_elems[9]._1_3_,local_688.data._M_elems._32_5_);
    puVar23 = pnVar25[lVar20].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar23 = local_688.data._M_elems._16_8_;
    *(ulong *)(puVar23 + 2) =
         CONCAT35(local_688.data._M_elems[7]._1_3_,local_688.data._M_elems._24_5_);
    *(undefined8 *)&pnVar25[lVar20].m_backend.data = local_688.data._M_elems._0_8_;
    *(undefined8 *)(pnVar25[lVar20].m_backend.data._M_elems + 2) = local_688.data._M_elems._8_8_;
    pnVar25[lVar20].m_backend.exp = local_688.exp;
    pnVar25[lVar20].m_backend.neg = local_688.neg;
    uVar29 = local_688._48_8_;
    break;
  case ZERO:
    goto switchD_0032af29_caseD_3;
  case BASIC:
    local_698 = (cpp_dec_float<50U,_int,_void> *)rStatus;
    local_318 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 8);
    local_338 = *(uint (*) [2])(pZVar30->m_lower).m_backend.data._M_elems;
    auStack_330 = *(uint (*) [2])((pZVar30->m_lower).m_backend.data._M_elems + 2);
    local_328 = *(uint (*) [2])((pZVar30->m_lower).m_backend.data._M_elems + 4);
    uStack_320 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 6);
    iVar17 = (pZVar30->m_lower).m_backend.exp;
    bVar7 = (pZVar30->m_lower).m_backend.neg;
    local_348[1]._1_3_ = local_588.data._M_elems[9]._1_3_;
    local_348._0_5_ = local_588.data._M_elems._32_5_;
    uStack_350 = CONCAT35(local_588.data._M_elems[7]._1_3_,local_588.data._M_elems._24_5_);
    local_358[0] = local_588.data._M_elems[4];
    local_358[1] = local_588.data._M_elems[5];
    local_368[0] = local_588.data._M_elems[0];
    local_368[1] = local_588.data._M_elems[1];
    auStack_360[0] = local_588.data._M_elems[2];
    auStack_360[1] = local_588.data._M_elems[3];
    local_64c = local_588.exp;
    local_5d0 = (cpp_dec_float<50U,_int,_void> *)CONCAT71(local_5d0._1_7_,local_588.neg);
    uVar12._0_4_ = (pZVar30->m_lower).m_backend.fpclass;
    uVar12._4_4_ = (pZVar30->m_lower).m_backend.prec_elem;
    local_648 = piVar21;
    (*(pZVar30->super_PostStep)._vptr_PostStep[6])(local_68,pZVar30);
    uVar13 = local_588._48_8_;
    local_688.data._M_elems[0] = local_338[0];
    local_688.data._M_elems[1] = local_338[1];
    local_688.data._M_elems[2] = auStack_330[0];
    local_688.data._M_elems[3] = auStack_330[1];
    local_688.data._M_elems[4] = local_328[0];
    local_688.data._M_elems[5] = local_328[1];
    local_688.data._M_elems._24_5_ = SUB85(uStack_320,0);
    local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_320 >> 0x28);
    local_688.data._M_elems._32_5_ = SUB85(local_318,0);
    local_688.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_318 >> 0x28);
    local_448.data._M_elems[2] = auStack_360[0];
    local_448.data._M_elems[3] = auStack_360[1];
    local_448.data._M_elems[0] = local_368[0];
    local_448.data._M_elems[1] = local_368[1];
    local_448.data._M_elems[4] = local_358[0];
    local_448.data._M_elems[5] = local_358[1];
    local_448.data._M_elems._24_5_ = SUB85(uStack_350,0);
    local_448.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_350 >> 0x28);
    local_448.data._M_elems[8] = local_348[0];
    local_448.data._M_elems[9] = local_348[1];
    local_448.exp = local_64c;
    local_448.neg = (bool)(char)local_5d0;
    local_588.fpclass = (fpclass_type)uVar10;
    local_588.prec_elem = SUB84(uVar10,4);
    local_448.fpclass = local_588.fpclass;
    local_448.prec_elem = local_588.prec_elem;
    local_688.exp = iVar17;
    local_688.neg = bVar7;
    local_688._48_8_ = uVar12;
    local_588._48_8_ = uVar13;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_6e8,(soplex *)&local_688,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_448,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)puVar23);
    pZVar30 = local_608;
    local_408.data._M_elems[0] = local_68[0];
    local_408.data._M_elems[1] = local_68[1];
    uVar10 = local_408.data._M_elems._0_8_;
    local_408.data._M_elems[2] = auStack_60[0];
    local_408.data._M_elems[3] = auStack_60[1];
    local_408.data._M_elems[8] = local_48[0];
    local_408.data._M_elems[9] = local_48[1];
    local_408.data._M_elems[4] = local_58[0];
    local_408.data._M_elems[5] = local_58[1];
    local_408.data._M_elems[6] = auStack_50[0];
    local_408.data._M_elems[7] = auStack_50[1];
    local_408.exp = local_40;
    uVar27 = (undefined7)((ulong)puVar23 >> 8);
    pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)CONCAT71(uVar27,local_3c);
    local_408.neg = (bool)local_3c;
    local_408.fpclass = local_38;
    local_408.prec_elem = iStack_34;
    local_408.data._M_elems[0] = local_68[0];
    if (local_408.data._M_elems[0] != 0 || (fpclass_type)_local_38 != cpp_dec_float_finite) {
      pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)(CONCAT71(uVar27,local_3c) ^ 1);
      local_408.neg = SUB81(pnVar24,0);
    }
    pnVar1 = &local_608->m_lower;
    local_408.data._M_elems._0_8_ = uVar10;
    if ((((fpclass_type)_local_38 != cpp_dec_float_NaN) && (local_6e8.fpclass != cpp_dec_float_NaN))
       && (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_6e8,&local_408), 0 < iVar17)) {
      ::soplex::infinity::__tls_init();
      pdVar18 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_6e8.fpclass = cpp_dec_float_finite;
      local_6e8.prec_elem = 10;
      local_6e8.data._M_elems[0] = 0;
      local_6e8.data._M_elems[1] = 0;
      local_6e8.data._M_elems[2] = 0;
      local_6e8.data._M_elems[3] = 0;
      local_6e8.data._M_elems[4] = 0;
      local_6e8.data._M_elems[5] = 0;
      local_6e8.data._M_elems._24_5_ = 0;
      local_6e8.data._M_elems[7]._1_3_ = 0;
      local_6e8.data._M_elems._32_5_ = 0;
      local_6e8.data._M_elems[9]._1_3_ = 0;
      local_6e8.exp = 0;
      local_6e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_6e8,-*pdVar18);
      if ((((pZVar30->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
          (local_6e8.fpclass != cpp_dec_float_NaN)) &&
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&pnVar1->m_backend,&local_6e8), piVar21 = local_648,
         pVVar34 = local_6a0, pVVar36 = local_6a8, 0 < iVar17)) {
        iVar17 = pZVar30->m_j;
        pnVar25 = (local_6a0->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 8) =
             *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 8);
        uVar10 = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        uVar12 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 2);
        uVar13 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 6);
        puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar23 = *(undefined8 *)((pZVar30->m_lower).m_backend.data._M_elems + 4);
        *(undefined8 *)(puVar23 + 2) = uVar13;
        *(undefined8 *)&pnVar25[iVar17].m_backend.data = uVar10;
        *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 2) = uVar12;
        pnVar25[iVar17].m_backend.exp = (pZVar30->m_lower).m_backend.exp;
        pnVar25[iVar17].m_backend.neg = (pZVar30->m_lower).m_backend.neg;
        uVar9 = (pZVar30->m_lower).m_backend.fpclass;
        uVar11 = (pZVar30->m_lower).m_backend.prec_elem;
        pnVar25[iVar17].m_backend.fpclass = uVar9;
        pnVar25[iVar17].m_backend.prec_elem = uVar11;
        VVar37 = ON_LOWER;
        if ((uVar9 != 2) && ((pZVar30->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&pnVar1->m_backend,&(pZVar30->m_upper).m_backend);
          VVar37 = (iVar17 == 0) + ON_LOWER;
        }
        pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_6b0->data;
        piVar38 = piVar21;
        goto LAB_0032bc19;
      }
    }
    uVar10 = local_5c8._48_8_;
    bVar16 = local_5c8.neg;
    local_378 = *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 8);
    local_398 = *(uint (*) [2])(pZVar30->m_upper).m_backend.data._M_elems;
    auStack_390 = *(uint (*) [2])((pZVar30->m_upper).m_backend.data._M_elems + 2);
    local_388 = *(uint (*) [2])((pZVar30->m_upper).m_backend.data._M_elems + 4);
    uStack_380 = *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 6);
    iVar17 = (pZVar30->m_upper).m_backend.exp;
    bVar7 = (pZVar30->m_upper).m_backend.neg;
    local_3a8[1]._1_3_ = local_5c8.data._M_elems[9]._1_3_;
    local_3a8._0_5_ = local_5c8.data._M_elems._32_5_;
    uStack_3b0 = CONCAT35(local_5c8.data._M_elems[7]._1_3_,local_5c8.data._M_elems._24_5_);
    local_3b8[0] = local_5c8.data._M_elems[4];
    local_3b8[1] = local_5c8.data._M_elems[5];
    local_3c8[0] = local_5c8.data._M_elems[0];
    local_3c8[1] = local_5c8.data._M_elems[1];
    lStack_3c0._0_4_ = local_5c8.data._M_elems[2];
    lStack_3c0._4_4_ = local_5c8.data._M_elems[3];
    local_64c = local_5c8.exp;
    uVar13._0_4_ = (pZVar30->m_upper).m_backend.fpclass;
    uVar13._4_4_ = (pZVar30->m_upper).m_backend.prec_elem;
    local_5d0 = &pnVar1->m_backend;
    (*(pZVar30->super_PostStep)._vptr_PostStep[6])(&local_180);
    uVar12 = local_5c8._48_8_;
    local_688.data._M_elems[0] = local_398[0];
    local_688.data._M_elems[1] = local_398[1];
    local_688.data._M_elems[2] = auStack_390[0];
    local_688.data._M_elems[3] = auStack_390[1];
    local_688.data._M_elems[4] = local_388[0];
    local_688.data._M_elems[5] = local_388[1];
    local_688.data._M_elems._24_5_ = SUB85(uStack_380,0);
    local_688.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_380 >> 0x28);
    local_688.data._M_elems._32_5_ = SUB85(local_378,0);
    local_688.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_378 >> 0x28);
    local_448.data._M_elems._8_8_ = lStack_3c0;
    local_448.data._M_elems[0] = local_3c8[0];
    local_448.data._M_elems[1] = local_3c8[1];
    local_448.data._M_elems[4] = local_3b8[0];
    local_448.data._M_elems[5] = local_3b8[1];
    local_448.data._M_elems._24_5_ = SUB85(uStack_3b0,0);
    local_448.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_3b0 >> 0x28);
    local_448.data._M_elems[8] = local_3a8[0];
    local_448.data._M_elems[9] = local_3a8[1];
    local_448.exp = local_64c;
    local_448.neg = bVar16;
    local_5c8.fpclass = (fpclass_type)uVar10;
    local_5c8.prec_elem = SUB84(uVar10,4);
    local_448.fpclass = local_5c8.fpclass;
    local_448.prec_elem = local_5c8.prec_elem;
    local_688.exp = iVar17;
    local_688.neg = bVar7;
    local_688._48_8_ = uVar13;
    local_5c8._48_8_ = uVar12;
    relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_6e8,(soplex *)&local_688,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_448,pnVar24);
    pVVar36 = local_6a8;
    piVar38 = local_648;
    if (((local_6e8.fpclass != cpp_dec_float_NaN) && (local_180.fpclass != cpp_dec_float_NaN)) &&
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_6e8,&local_180), piVar21 = local_648, pVVar36 = local_6a8,
       piVar38 = piVar21, iVar17 < 1)) {
      ::soplex::infinity::__tls_init();
      pdVar18 = (double *)__tls_get_addr(&PTR_003b4b70);
      local_6e8.fpclass = cpp_dec_float_finite;
      local_6e8.prec_elem = 10;
      local_6e8.data._M_elems[0] = 0;
      local_6e8.data._M_elems[1] = 0;
      local_6e8.data._M_elems[2] = 0;
      local_6e8.data._M_elems[3] = 0;
      local_6e8.data._M_elems[4] = 0;
      local_6e8.data._M_elems[5] = 0;
      local_6e8.data._M_elems._24_5_ = 0;
      local_6e8.data._M_elems[7]._1_3_ = 0;
      local_6e8.data._M_elems._32_5_ = 0;
      local_6e8.data._M_elems[9]._1_3_ = 0;
      local_6e8.exp = 0;
      local_6e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_6e8,*pdVar18);
      pZVar30 = local_608;
      if (((local_608->m_upper).m_backend.fpclass != cpp_dec_float_NaN) &&
         (local_6e8.fpclass != cpp_dec_float_NaN)) {
        pnVar24 = &local_608->m_upper;
        iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&pnVar24->m_backend,&local_6e8);
        pVVar34 = local_6a0;
        if (iVar17 < 0) {
          iVar17 = pZVar30->m_j;
          pnVar25 = (local_6a0->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 8) =
               *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 8);
          uVar10 = *(undefined8 *)(pnVar24->m_backend).data._M_elems;
          uVar12 = *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 2);
          uVar13 = *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 6);
          puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar23 = *(undefined8 *)((pZVar30->m_upper).m_backend.data._M_elems + 4);
          *(undefined8 *)(puVar23 + 2) = uVar13;
          *(undefined8 *)&pnVar25[iVar17].m_backend.data = uVar10;
          *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 2) = uVar12;
          pnVar25[iVar17].m_backend.exp = (pZVar30->m_upper).m_backend.exp;
          pnVar25[iVar17].m_backend.neg = (pZVar30->m_upper).m_backend.neg;
          iVar14 = (pZVar30->m_upper).m_backend.prec_elem;
          pnVar25[iVar17].m_backend.fpclass = (pZVar30->m_upper).m_backend.fpclass;
          pnVar25[iVar17].m_backend.prec_elem = iVar14;
          VVar37 = ON_UPPER;
          if (((pZVar30->m_lower).m_backend.fpclass != cpp_dec_float_NaN) &&
             ((pZVar30->m_upper).m_backend.fpclass != cpp_dec_float_NaN)) {
            iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (local_5d0,&pnVar24->m_backend);
            VVar37 = (uint)(iVar17 == 0) * 2;
          }
          goto LAB_0032bb4a;
        }
      }
    }
    ::soplex::infinity::__tls_init();
    local_698 = (cpp_dec_float<50U,_int,_void> *)((long)local_698 + 8);
    puVar19 = (ulong *)__tls_get_addr(&PTR_003b4b70);
    local_608 = (ZeroObjColSingletonPS *)*puVar19;
    uStack_600 = 0;
    local_6e8.fpclass = cpp_dec_float_finite;
    local_6e8.prec_elem = 10;
    local_6e8.data._M_elems[0] = 0;
    local_6e8.data._M_elems[1] = 0;
    local_6e8.data._M_elems[2] = 0;
    local_6e8.data._M_elems[3] = 0;
    local_6e8.data._M_elems[4] = 0;
    local_6e8.data._M_elems[5] = 0;
    local_6e8.data._M_elems._24_5_ = 0;
    local_6e8.data._M_elems[7]._1_3_ = 0;
    local_6e8.data._M_elems._32_5_ = 0;
    local_6e8.data._M_elems[9]._1_3_ = 0;
    local_6e8.exp = 0;
    local_6e8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_6e8,-(double)local_608);
    piVar21 = piVar32;
    if (((local_588.fpclass == cpp_dec_float_NaN) || (local_6e8.fpclass == cpp_dec_float_NaN)) ||
       (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_588,&local_6e8), pVVar34 = local_6a0, iVar17 < 1)) {
      ::soplex::infinity::__tls_init();
      local_6e8.fpclass = cpp_dec_float_finite;
      local_6e8.prec_elem = 10;
      local_6e8.data._M_elems[0] = 0;
      local_6e8.data._M_elems[1] = 0;
      local_6e8.data._M_elems[2] = 0;
      local_6e8.data._M_elems[3] = 0;
      local_6e8.data._M_elems[4] = 0;
      local_6e8.data._M_elems[5] = 0;
      local_6e8.data._M_elems._24_5_ = 0;
      local_6e8.data._M_elems[7]._1_3_ = 0;
      local_6e8.data._M_elems._32_5_ = 0;
      local_6e8.data._M_elems[9]._1_3_ = 0;
      local_6e8.exp = 0;
      local_6e8.neg = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_6e8,(double)local_608);
      if (((local_5c8.fpclass == cpp_dec_float_NaN) || (local_6e8.fpclass == cpp_dec_float_NaN)) ||
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&local_5c8,&local_6e8), pVVar34 = local_6a0, -1 < iVar17)) {
        puVar22 = (undefined8 *)__cxa_allocate_exception(0x28);
        local_6e8.data._M_elems._0_8_ = local_6e8.data._M_elems + 4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6e8,"XMAISM03 This should never happen.","");
        *puVar22 = &PTR__SPxException_003adbd8;
        puVar22[1] = puVar22 + 3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar22 + 1),local_6e8.data._M_elems._0_8_,
                   local_6e8.data._M_elems._0_8_ + local_6e8.data._M_elems._8_8_);
        *puVar22 = &PTR__SPxException_003ae9a0;
        __cxa_throw(puVar22,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      iVar17 = *piVar38;
      pnVar25 = (local_6a0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar25[iVar17].m_backend.data._M_elems + 8) =
           CONCAT35(local_5c8.data._M_elems[9]._1_3_,local_5c8.data._M_elems._32_5_);
      puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar23 = local_5c8.data._M_elems._16_8_;
      *(ulong *)(puVar23 + 2) =
           CONCAT35(local_5c8.data._M_elems[7]._1_3_,local_5c8.data._M_elems._24_5_);
      *(undefined8 *)&pnVar25[iVar17].m_backend.data = local_5c8.data._M_elems._0_8_;
      *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 2) = local_5c8.data._M_elems._8_8_;
      pnVar25[iVar17].m_backend.exp = local_5c8.exp;
      pnVar25[iVar17].m_backend.neg = local_5c8.neg;
      pnVar25[iVar17].m_backend.fpclass = local_5c8.fpclass;
      pnVar25[iVar17].m_backend.prec_elem = local_5c8.prec_elem;
      local_6b0->data[*piVar38] = BASIC;
      VVar37 = ON_LOWER;
      pcVar26 = local_698;
      if (local_640.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_6e8,0,(type *)0x0);
        piVar38 = local_648;
        iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_640,&local_6e8);
        VVar37 = (VarStatus)(iVar17 < 1);
        pcVar26 = local_698;
      }
    }
    else {
      iVar17 = *piVar38;
      pnVar25 = (local_6a0->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      *(ulong *)(pnVar25[iVar17].m_backend.data._M_elems + 8) =
           CONCAT35(local_588.data._M_elems[9]._1_3_,local_588.data._M_elems._32_5_);
      puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar23 = local_588.data._M_elems._16_8_;
      *(ulong *)(puVar23 + 2) =
           CONCAT35(local_588.data._M_elems[7]._1_3_,local_588.data._M_elems._24_5_);
      *(undefined8 *)&pnVar25[iVar17].m_backend.data = local_588.data._M_elems._0_8_;
      *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 2) = local_588.data._M_elems._8_8_;
      pnVar25[iVar17].m_backend.exp = local_588.exp;
      pnVar25[iVar17].m_backend.neg = local_588.neg;
      pnVar25[iVar17].m_backend.fpclass = local_588.fpclass;
      pnVar25[iVar17].m_backend.prec_elem = local_588.prec_elem;
      local_6b0->data[*piVar38] = BASIC;
      VVar37 = ON_UPPER;
      pcVar26 = local_698;
      if (local_640.fpclass != cpp_dec_float_NaN) {
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&local_6e8,0,(type *)0x0);
        piVar38 = local_648;
        iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_640,&local_6e8);
        VVar37 = (VarStatus)(0 < iVar17);
        pcVar26 = local_698;
      }
    }
    goto LAB_0032bc19;
  }
  *(undefined8 *)&pnVar25[lVar20].m_backend.fpclass = uVar29;
  VVar37 = FIXED;
  pVVar34 = local_6a0;
  pVVar36 = local_6a8;
LAB_0032bb4a:
  pcVar26 = (cpp_dec_float<50U,_int,_void> *)&local_6b0->data;
  piVar38 = piVar21;
LAB_0032bc19:
  (*(VarStatus **)pcVar26)[*piVar21] = VVar37;
  pcVar35 = &(pVVar34->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*piVar38].m_backend;
  local_6e8.fpclass = cpp_dec_float_finite;
  local_6e8.prec_elem = 10;
  local_6e8.data._M_elems[0] = 0;
  local_6e8.data._M_elems[1] = 0;
  local_6e8.data._M_elems[2] = 0;
  local_6e8.data._M_elems[3] = 0;
  local_6e8.data._M_elems[4] = 0;
  local_6e8.data._M_elems[5] = 0;
  local_6e8.data._M_elems._24_5_ = 0;
  local_6e8.data._M_elems[7]._1_3_ = 0;
  local_6e8.data._M_elems._32_5_ = 0;
  local_6e8.data._M_elems[9]._1_3_ = 0;
  local_6e8.exp = 0;
  local_6e8.neg = false;
  pcVar26 = &local_640;
  if (&local_6e8 != pcVar35) {
    local_6e8.data._M_elems._32_5_ = local_640.data._M_elems._32_5_;
    local_6e8.data._M_elems[9]._1_3_ = local_640.data._M_elems[9]._1_3_;
    local_6e8.data._M_elems[4] = local_640.data._M_elems[4];
    local_6e8.data._M_elems[5] = local_640.data._M_elems[5];
    local_6e8.data._M_elems._24_5_ = local_640.data._M_elems._24_5_;
    local_6e8.data._M_elems[7]._1_3_ = local_640.data._M_elems[7]._1_3_;
    local_6e8.data._M_elems[2] = local_640.data._M_elems[2];
    local_6e8.data._M_elems[3] = local_640.data._M_elems[3];
    local_6e8.data._M_elems[0] = local_640.data._M_elems[0];
    local_6e8.data._M_elems[1] = local_640.data._M_elems[1];
    local_6e8.exp = local_640.exp;
    local_6e8.neg = local_640.neg;
    local_6e8.prec_elem = local_640.prec_elem;
    local_6e8.fpclass = local_640.fpclass;
    pcVar26 = pcVar35;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_6e8,pcVar26);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(local_5f0->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[*piVar32].m_backend,&local_6e8);
  local_6e8.fpclass = cpp_dec_float_finite;
  local_6e8.prec_elem = 10;
  local_6e8.data._M_elems[0] = 0;
  local_6e8.data._M_elems[1] = 0;
  local_6e8.data._M_elems[2] = 0;
  local_6e8.data._M_elems[3] = 0;
  local_6e8.data._M_elems[4] = 0;
  local_6e8.data._M_elems[5] = 0;
  local_6e8.data._M_elems._24_5_ = 0;
  local_6e8.data._M_elems[7]._1_3_ = 0;
  local_6e8.data._M_elems._32_5_ = 0;
  local_6e8.data._M_elems[9]._1_3_ = 0;
  local_6e8.exp = 0;
  local_6e8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&local_6e8,-1.0);
  local_688.data._M_elems[0] = local_640.data._M_elems[0];
  local_688.data._M_elems[1] = local_640.data._M_elems[1];
  local_688.data._M_elems[2] = local_640.data._M_elems[2];
  local_688.data._M_elems[3] = local_640.data._M_elems[3];
  local_688.data._M_elems[4] = local_640.data._M_elems[4];
  local_688.data._M_elems[5] = local_640.data._M_elems[5];
  local_688.data._M_elems._24_5_ = local_640.data._M_elems._24_5_;
  local_688.data._M_elems[7]._1_3_ = local_640.data._M_elems[7]._1_3_;
  local_688.data._M_elems._32_5_ = local_640.data._M_elems._32_5_;
  local_688.data._M_elems[9]._1_3_ = local_640.data._M_elems[9]._1_3_;
  local_688.exp = local_640.exp;
  local_688.neg = local_640.neg;
  local_688.prec_elem = local_640.prec_elem;
  local_688.fpclass = local_640.fpclass;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_688,&local_6e8);
  pcVar35 = &(local_450->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*piVar32].m_backend;
  local_6e8.fpclass = cpp_dec_float_finite;
  local_6e8.prec_elem = 10;
  local_6e8.data._M_elems[0] = 0;
  local_6e8.data._M_elems[1] = 0;
  local_6e8.data._M_elems[2] = 0;
  local_6e8.data._M_elems[3] = 0;
  local_6e8.data._M_elems[4] = 0;
  local_6e8.data._M_elems[5] = 0;
  local_6e8.data._M_elems._24_5_ = 0;
  local_6e8.data._M_elems[7]._1_3_ = 0;
  local_6e8.data._M_elems._32_5_ = 0;
  local_6e8.data._M_elems[9]._1_3_ = 0;
  local_6e8.exp = 0;
  local_6e8.neg = false;
  pcVar26 = &local_688;
  if (&local_6e8 != pcVar35) {
    local_6e8.data._M_elems._32_5_ = local_688.data._M_elems._32_5_;
    local_6e8.data._M_elems[9]._1_3_ = local_688.data._M_elems[9]._1_3_;
    local_6e8.data._M_elems[4] = local_688.data._M_elems[4];
    local_6e8.data._M_elems[5] = local_688.data._M_elems[5];
    local_6e8.data._M_elems._24_5_ = local_688.data._M_elems._24_5_;
    local_6e8.data._M_elems[7]._1_3_ = local_688.data._M_elems[7]._1_3_;
    local_6e8.data._M_elems[0] = local_688.data._M_elems[0];
    local_6e8.data._M_elems[1] = local_688.data._M_elems[1];
    local_6e8.data._M_elems[2] = local_688.data._M_elems[2];
    local_6e8.data._M_elems[3] = local_688.data._M_elems[3];
    local_6e8.exp = local_688.exp;
    local_6e8.neg = local_688.neg;
    local_6e8.fpclass = local_688.fpclass;
    local_6e8.prec_elem = local_688.prec_elem;
    pcVar26 = pcVar35;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_6e8,pcVar26);
  iVar17 = *piVar38;
  pnVar25 = (pVVar36->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar25[iVar17].m_backend.data._M_elems + 8) =
       CONCAT35(local_6e8.data._M_elems[9]._1_3_,local_6e8.data._M_elems._32_5_);
  puVar23 = pnVar25[iVar17].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar23 = local_6e8.data._M_elems._16_8_;
  *(ulong *)(puVar23 + 2) =
       CONCAT35(local_6e8.data._M_elems[7]._1_3_,local_6e8.data._M_elems._24_5_);
  *(undefined8 *)&pnVar25[iVar17].m_backend.data = local_6e8.data._M_elems._0_8_;
  *(undefined8 *)(pnVar25[iVar17].m_backend.data._M_elems + 2) = local_6e8.data._M_elems._8_8_;
  pnVar25[iVar17].m_backend.exp = local_6e8.exp;
  pnVar25[iVar17].m_backend.neg = local_6e8.neg;
  pnVar25[iVar17].m_backend.fpclass = local_6e8.fpclass;
  pnVar25[iVar17].m_backend.prec_elem = local_6e8.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}